

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O0

void nh_lib_exit(void)

{
  int local_c;
  int i;
  
  xmalloc_cleanup();
  for (local_c = 0; local_c < 6; local_c = local_c + 1) {
    free(fqn_prefix[local_c]);
    fqn_prefix[local_c] = (char *)0x0;
  }
  cleanup_opt_struct();
  return;
}

Assistant:

void nh_lib_exit(void)
{
    int i;
    
    xmalloc_cleanup();
    
    for (i = 0; i < PREFIX_COUNT; i++) {
	free(fqn_prefix[i]);
	fqn_prefix[i] = NULL;
    }
    
    cleanup_opt_struct();
}